

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_get_key_attributes(psa_key_handle_t handle,psa_key_attributes_t *attributes)

{
  psa_key_type_t pVar1;
  undefined8 uVar2;
  psa_algorithm_t pVar3;
  psa_key_bits_t pVar4;
  psa_key_lifetime_t pVar5;
  psa_key_id_t pVar6;
  psa_key_usage_t pVar7;
  int local_24;
  psa_key_slot_t *ppStack_20;
  psa_status_t status;
  psa_key_slot_t *slot;
  psa_key_attributes_t *attributes_local;
  psa_key_handle_t handle_local;
  
  slot = (psa_key_slot_t *)attributes;
  attributes_local._2_2_ = handle;
  psa_reset_key_attributes(attributes);
  local_24 = psa_get_key_from_slot(attributes_local._2_2_,&stack0xffffffffffffffe0,0,0);
  attributes_local._4_4_ = local_24;
  if (local_24 == 0) {
    pVar1 = (ppStack_20->attr).type;
    pVar4 = (ppStack_20->attr).bits;
    pVar5 = (ppStack_20->attr).lifetime;
    pVar6 = (ppStack_20->attr).id;
    pVar7 = (ppStack_20->attr).policy.usage;
    pVar3 = (ppStack_20->attr).policy.alg;
    uVar2 = *(undefined8 *)&(ppStack_20->attr).policy.alg2;
    (slot->attr).policy.usage = (ppStack_20->attr).policy.usage;
    (slot->attr).policy.alg = pVar3;
    *(undefined8 *)&(slot->attr).policy.alg2 = uVar2;
    (slot->attr).type = pVar1;
    (slot->attr).bits = pVar4;
    (slot->attr).lifetime = pVar5;
    (slot->attr).id = pVar6;
    (slot->attr).policy.usage = pVar7;
    (slot->attr).flags = (slot->attr).flags & 1;
    pVar1 = (ppStack_20->attr).type;
    if ((pVar1 == 0x4001) || (pVar1 == 0x7001)) {
      local_24 = psa_get_rsa_public_exponent((ppStack_20->data).rsa,(psa_key_attributes_t *)slot);
    }
    if (local_24 != 0) {
      psa_reset_key_attributes((psa_key_attributes_t *)slot);
    }
    attributes_local._4_4_ = local_24;
  }
  return attributes_local._4_4_;
}

Assistant:

psa_status_t psa_get_key_attributes( psa_key_handle_t handle,
                                     psa_key_attributes_t *attributes )
{
    psa_key_slot_t *slot;
    psa_status_t status;

    psa_reset_key_attributes( attributes );

    status = psa_get_key_from_slot( handle, &slot, 0, 0 );
    if( status != PSA_SUCCESS )
        return( status );

    attributes->core = slot->attr;
    attributes->core.flags &= ( MBEDTLS_PSA_KA_MASK_EXTERNAL_ONLY |
                                MBEDTLS_PSA_KA_MASK_DUAL_USE );

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( psa_key_slot_is_external( slot ) )
        psa_set_key_slot_number( attributes, slot->data.se.slot_number );
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    switch( slot->attr.type )
    {
#if defined(MBEDTLS_RSA_C)
        case PSA_KEY_TYPE_RSA_KEY_PAIR:
        case PSA_KEY_TYPE_RSA_PUBLIC_KEY:
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
            /* TODO: reporting the public exponent for opaque keys
             * is not yet implemented.
             * https://github.com/ARMmbed/mbed-crypto/issues/216
             */
            if( psa_key_slot_is_external( slot ) )
                break;
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
            status = psa_get_rsa_public_exponent( slot->data.rsa, attributes );
            break;
#endif /* MBEDTLS_RSA_C */
        default:
            /* Nothing else to do. */
            break;
    }

    if( status != PSA_SUCCESS )
        psa_reset_key_attributes( attributes );
    return( status );
}